

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage7_high48_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  undefined4 uVar6;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  undefined4 uVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  
  uVar7 = 0x61ff138;
  uVar6 = 0xf138f9e1;
  alVar1[1] = in_XMM0_Qb;
  alVar1[0] = in_XMM0_Qa;
  alVar1[2] = in_YMM0_H;
  alVar1[3] = in_register_00001218;
  alVar5[1]._0_4_ = 0x61ff138;
  alVar5[0] = 0x61ff138061ff138;
  alVar5[1]._4_4_ = 0x61ff138;
  alVar5[2]._0_4_ = 0x61ff138;
  alVar5[2]._4_4_ = 0x61ff138;
  alVar5[3]._0_4_ = 0x61ff138;
  alVar5[3]._4_4_ = 0x61ff138;
  _r_00[1]._0_4_ = 0xf138f9e1;
  _r_00[0] = 0xf138f9e1f138f9e1;
  _r_00[1]._4_4_ = 0xf138f9e1;
  _r_00[2]._0_4_ = 0xf138f9e1;
  _r_00[2]._4_4_ = 0xf138f9e1;
  _r_00[3]._0_4_ = 0xf138f9e1;
  _r_00[3]._4_4_ = 0xf138f9e1;
  uVar8 = uVar7;
  uVar9 = uVar7;
  uVar10 = uVar7;
  uVar11 = uVar7;
  uVar12 = uVar7;
  uVar13 = uVar7;
  uVar14 = uVar7;
  uVar15 = uVar6;
  uVar16 = uVar6;
  uVar17 = uVar6;
  uVar18 = uVar6;
  uVar19 = uVar6;
  uVar20 = uVar6;
  uVar21 = uVar6;
  btf_16_w16_avx2(alVar1,alVar5,x + 0x12,x + 0x1d,_r_00,0xf138);
  alVar2[1] = in_XMM0_Qb;
  alVar2[0] = in_XMM0_Qa;
  alVar2[2] = in_YMM0_H;
  alVar2[3] = in_register_00001218;
  w1[0]._4_4_ = uVar8;
  w1[0]._0_4_ = uVar7;
  w1[1]._0_4_ = uVar9;
  w1[1]._4_4_ = uVar10;
  w1[2]._0_4_ = uVar11;
  w1[2]._4_4_ = uVar12;
  w1[3]._0_4_ = uVar13;
  w1[3]._4_4_ = uVar14;
  _r_01[0]._4_4_ = uVar15;
  _r_01[0]._0_4_ = uVar6;
  _r_01[1]._0_4_ = uVar16;
  _r_01[1]._4_4_ = uVar17;
  _r_01[2]._0_4_ = uVar18;
  _r_01[2]._4_4_ = uVar19;
  _r_01[3]._0_4_ = uVar20;
  _r_01[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar2,w1,x + 0x13,x + 0x1c,_r_01,cos_bit_00);
  alVar3[1] = in_XMM0_Qb;
  alVar3[0] = in_XMM0_Qa;
  alVar3[2] = in_YMM0_H;
  alVar3[3] = in_register_00001218;
  w1_00[0]._4_4_ = uVar8;
  w1_00[0]._0_4_ = uVar7;
  w1_00[1]._0_4_ = uVar9;
  w1_00[1]._4_4_ = uVar10;
  w1_00[2]._0_4_ = uVar11;
  w1_00[2]._4_4_ = uVar12;
  w1_00[3]._0_4_ = uVar13;
  w1_00[3]._4_4_ = uVar14;
  _r_02[0]._4_4_ = uVar15;
  _r_02[0]._0_4_ = uVar6;
  _r_02[1]._0_4_ = uVar16;
  _r_02[1]._4_4_ = uVar17;
  _r_02[2]._0_4_ = uVar18;
  _r_02[2]._4_4_ = uVar19;
  _r_02[3]._0_4_ = uVar20;
  _r_02[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar3,w1_00,x + 0x14,x + 0x1b,_r_02,cos_bit_01);
  alVar4[1] = in_XMM0_Qb;
  alVar4[0] = in_XMM0_Qa;
  alVar4[2] = in_YMM0_H;
  alVar4[3] = in_register_00001218;
  w1_01[0]._4_4_ = uVar8;
  w1_01[0]._0_4_ = uVar7;
  w1_01[1]._0_4_ = uVar9;
  w1_01[1]._4_4_ = uVar10;
  w1_01[2]._0_4_ = uVar11;
  w1_01[2]._4_4_ = uVar12;
  w1_01[3]._0_4_ = uVar13;
  w1_01[3]._4_4_ = uVar14;
  _r_03[0]._4_4_ = uVar15;
  _r_03[0]._0_4_ = uVar6;
  _r_03[1]._0_4_ = uVar16;
  _r_03[1]._4_4_ = uVar17;
  _r_03[2]._0_4_ = uVar18;
  _r_03[2]._4_4_ = uVar19;
  _r_03[3]._0_4_ = uVar20;
  _r_03[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar4,w1_01,x + 0x15,x + 0x1a,_r_03,cos_bit_02);
  alVar1 = x[0x20];
  alVar2 = x[0x21];
  alVar3 = x[0x22];
  alVar4 = x[0x23];
  alVar5 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x27]);
  x[0x20] = alVar5;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x27]);
  x[0x27] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x26]);
  x[0x21] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x26]);
  x[0x26] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar3,(undefined1  [32])x[0x25]);
  x[0x22] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar3,(undefined1  [32])x[0x25]);
  x[0x25] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar4,(undefined1  [32])x[0x24]);
  x[0x23] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar4,(undefined1  [32])x[0x24]);
  x[0x24] = alVar1;
  alVar1 = x[0x2f];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x28]);
  x[0x2f] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x28]);
  x[0x28] = alVar1;
  alVar1 = x[0x2e];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x29]);
  x[0x2e] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x29]);
  x[0x29] = alVar1;
  alVar1 = x[0x2d];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2a]);
  x[0x2d] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2a]);
  x[0x2a] = alVar1;
  alVar1 = x[0x2c];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2b]);
  x[0x2c] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2b]);
  x[0x2b] = alVar1;
  alVar1 = x[0x30];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x37]);
  x[0x30] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x37]);
  x[0x37] = alVar1;
  alVar1 = x[0x31];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x36]);
  x[0x31] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x36]);
  x[0x36] = alVar1;
  alVar1 = x[0x32];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x35]);
  x[0x32] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x35]);
  x[0x35] = alVar1;
  alVar1 = x[0x33];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x34]);
  x[0x33] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x34]);
  x[0x34] = alVar1;
  alVar1 = x[0x3f];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x38]);
  x[0x3f] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x38]);
  x[0x38] = alVar1;
  alVar1 = x[0x3e];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x39]);
  x[0x3e] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x39]);
  x[0x39] = alVar1;
  alVar1 = x[0x3d];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3a]);
  x[0x3d] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3a]);
  x[0x3a] = alVar1;
  alVar1 = x[0x3c];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3b]);
  x[0x3c] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3b]);
  x[0x3b] = alVar1;
  return;
}

Assistant:

static inline void idct64_stage7_high48_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[19], &x[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[20], &x[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[21], &x[26], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[32], &x[39]);
  btf_16_adds_subs_avx2(&x[33], &x[38]);
  btf_16_adds_subs_avx2(&x[34], &x[37]);
  btf_16_adds_subs_avx2(&x[35], &x[36]);
  btf_16_adds_subs_avx2(&x[47], &x[40]);
  btf_16_adds_subs_avx2(&x[46], &x[41]);
  btf_16_adds_subs_avx2(&x[45], &x[42]);
  btf_16_adds_subs_avx2(&x[44], &x[43]);
  btf_16_adds_subs_avx2(&x[48], &x[55]);
  btf_16_adds_subs_avx2(&x[49], &x[54]);
  btf_16_adds_subs_avx2(&x[50], &x[53]);
  btf_16_adds_subs_avx2(&x[51], &x[52]);
  btf_16_adds_subs_avx2(&x[63], &x[56]);
  btf_16_adds_subs_avx2(&x[62], &x[57]);
  btf_16_adds_subs_avx2(&x[61], &x[58]);
  btf_16_adds_subs_avx2(&x[60], &x[59]);
}